

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_schnorrsig_verify(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  secp256k1_xonly_pubkey pk;
  int i;
  bench_schnorrsig_data *data;
  undefined1 local_5c [64];
  int local_1c;
  undefined8 *local_18;
  int local_c;
  
  local_1c = 0;
  local_18 = in_RDI;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_1c) {
      return;
    }
    iVar1 = secp256k1_xonly_pubkey_parse
                      (*local_18,local_5c,*(undefined8 *)(local_18[3] + (long)local_1c * 8));
    if (iVar1 != 1) break;
    iVar1 = secp256k1_schnorrsig_verify
                      (*local_18,*(undefined8 *)(local_18[4] + (long)local_1c * 8),
                       *(undefined8 *)(local_18[5] + (long)local_1c * 8),0x20,local_5c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
              ,0x2c,
              "test condition failed: secp256k1_schnorrsig_verify(data->ctx, data->sigs[i], data->msgs[i], MSGLEN, &pk)"
             );
      abort();
    }
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/bench_impl.h"
          ,0x2b,
          "test condition failed: secp256k1_xonly_pubkey_parse(data->ctx, &pk, data->pk[i]) == 1");
  abort();
}

Assistant:

static void bench_schnorrsig_verify(void* arg, int iters) {
    bench_schnorrsig_data *data = (bench_schnorrsig_data *)arg;
    int i;

    for (i = 0; i < iters; i++) {
        secp256k1_xonly_pubkey pk;
        CHECK(secp256k1_xonly_pubkey_parse(data->ctx, &pk, data->pk[i]) == 1);
        CHECK(secp256k1_schnorrsig_verify(data->ctx, data->sigs[i], data->msgs[i], MSGLEN, &pk));
    }
}